

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

uint __thiscall
ON_Mesh::ConvertNonPlanarQuadsToTriangles
          (ON_Mesh *this,double planar_tolerance,double angle_tolerance_radians,uint split_method)

{
  uint uVar1;
  
  uVar1 = ConvertNonPlanarQuadsToTriangles
                    (this,planar_tolerance,angle_tolerance_radians,split_method,false);
  return uVar1;
}

Assistant:

unsigned int ON_Mesh::ConvertNonPlanarQuadsToTriangles(
  double planar_tolerance,
  double angle_tolerance_radians,
  unsigned int split_method
)
{
  bool bDeleteNgonsContainingSplitQuads = false;
  return ConvertNonPlanarQuadsToTriangles(
    planar_tolerance,
    angle_tolerance_radians,
    split_method,
    bDeleteNgonsContainingSplitQuads
    );
}